

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  if ((this->wrapped).size_ == 0) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *(this->wrapped).ptr != '\0';
    if (_kjCondition.value) {
      return *(this->wrapped).ptr;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x22c,FAILED,"!exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
             &_kjCondition,(char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

bool exhausted() {
    return wrapped.size() == 0 || wrapped.front() == '\0';
  }